

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

void g_hash_table_foreach(GHashTable *hash_table,GHFunc func,gpointer user_data)

{
  GHashNode *pGVar1;
  GHashNode *node;
  gint i;
  gpointer user_data_local;
  GHFunc func_local;
  GHashTable *hash_table_local;
  
  if ((hash_table != (GHashTable *)0x0) && (func != (GHFunc)0x0)) {
    for (node._4_4_ = 0; node._4_4_ < hash_table->size; node._4_4_ = node._4_4_ + 1) {
      pGVar1 = hash_table->nodes + node._4_4_;
      if (1 < pGVar1->key_hash) {
        (*func)(pGVar1->key,pGVar1->value,user_data);
      }
    }
  }
  return;
}

Assistant:

void g_hash_table_foreach (GHashTable *hash_table,
        GHFunc      func,
        gpointer    user_data)
{
    gint i;

    if (hash_table == NULL) return;
    if (func == NULL) return;

    for (i = 0; i < hash_table->size; i++)
    {
        GHashNode *node = &hash_table->nodes [i];

        if (node->key_hash > 1)
            (* func) (node->key, node->value, user_data);
    }
}